

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::App::get_footer_abi_cxx11_(string *__return_storage_ptr__,App *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  App *local_18;
  App *this_local;
  
  local_18 = this;
  this_local = (App *)__return_storage_ptr__;
  bVar1 = ::std::function::operator_cast_to_bool((function *)&this->footer_callback_);
  if (bVar1) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_58,&this->footer_callback_);
    ::std::operator+(&local_38,&local_58,'\n');
    ::std::operator+(__return_storage_ptr__,&local_38,&this->footer_);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->footer_);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD std::string get_footer() const {
        return (footer_callback_) ? footer_callback_() + '\n' + footer_ : footer_;
    }